

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressTestUtil.cpp
# Opt level: O3

ProgramContext * __thiscall
deqp::gls::LongStressTestUtil::ProgramLibrary::generateVertexUniformLoopLightContext
          (ProgramContext *__return_storage_ptr__,ProgramLibrary *this,int texWid,int texHei)

{
  vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> *pvVar1;
  Vector<float,_4> *pVVar2;
  ProgramContext *pPVar3;
  undefined8 vtxShaderSource_;
  long *plVar4;
  size_type *psVar5;
  int iVar6;
  string ndxStr;
  ProgramContext *context;
  string local_278;
  Matrix<float,_4,_4> local_258;
  Matrix<float,_4,_4> local_218;
  ProgramContext *local_1d8;
  undefined1 local_1d0 [376];
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  int local_38;
  int local_34;
  
  local_258.m_data.m_data[0].m_data._0_8_ = local_258.m_data.m_data + 1;
  local_1d8 = __return_storage_ptr__;
  local_38 = texWid;
  local_34 = texHei;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,
             "${VTX_HEADER}struct Material {\n\tmediump vec3 ambientColor;\n\tmediump vec4 diffuseColor;\n\tmediump vec3 emissiveColor;\n\tmediump vec3 specularColor;\n\tmediump float shininess;\n};\nstruct Light {\n\tmediump vec3 color;\n\tmediump vec4 position;\n\tmediump vec3 direction;\n\tmediump float constantAttenuation;\n\tmediump float linearAttenuation;\n\tmediump float quadraticAttenuation;\n\tmediump float spotExponent;\n\tmediump float spotCutoff;\n};\n${VTX_IN} highp vec4 a_position${NS};\n${VTX_IN} mediump vec3 a_normal${NS};\n${VTX_IN} mediump vec4 a_texCoord0${NS};\nuniform Material u_material${NS};\nuniform Light u_directionalLight${NS}[1];\nuniform mediump int u_directionalLightCount${NS};\nuniform Light u_spotLight${NS}[4];\nuniform mediump int u_spotLightCount${NS};\nuniform highp mat4 u_mvpMatrix${NS};\nuniform highp mat4 u_modelViewMatrix${NS};\nuniform mediump mat3 u_normalMatrix${NS};\nuniform mediump mat4 u_texCoordMatrix0${NS};\n${VTX_OUT} mediump vec4 v_color${NS};\n${VTX_OUT} mediump vec2 v_texCoord0${NS};\nmediump vec3 direction (mediump vec4 from, mediump vec4 to)\n{\n\treturn vec3(to.xyz * from.w - from.xyz * to.w);\n}\n\nmediump vec3 computeLighting (\n\tmediump vec3 directionToLight,\n\tmediump vec3 halfVector,\n\tmediump vec3 normal,\n\tmediump vec3 lightColor,\n\tmediump vec3 diffuseColor,\n\tmediump vec3 specularColor,\n\tmediump float shininess)\n{\n\tmediump float normalDotDirection  = max(dot(normal, directionToLight), 0.0);\n\tmediump vec3  color               = normalDotDirection * diffuseColor * lightColor;\n\n\tif (normalDotDirection != 0.0)\n\t\tcolor += pow(max(dot(normal, halfVector), 0.0), shininess) * specularColor * lightColor;\n\n\treturn color;\n}\n\nmediump float computeDistanceAttenuation (mediump float distToLight, mediump float constAtt, mediump float linearAtt, mediump float quadraticAtt)\n{\n\treturn 1.0 / (constAtt + linearAtt * distToLight + quadraticAtt * distToLight * distToLight);\n}\n\nmediump float computeSpotAttenuation (\n\tmediump vec3  directionToLight,\n\tmediump vec3  lightDir,\n\tmediump float spotExponent,\n\tmediump float spotCutoff)\n{\n\tmediump flo..." /* TRUNCATED STRING LITERAL */
             ,"");
  substitute((string *)local_1d0,this,(string *)&local_258);
  vtxShaderSource_ = local_1d0._0_8_;
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,
             "${FRAG_HEADER}uniform sampler2D u_sampler0${NS};\n${FRAG_IN} mediump vec4 v_color${NS};\n${FRAG_IN} mediump vec2 v_texCoord0${NS};\nvoid main (void)\n{\n\tmediump vec2 texCoord0 = v_texCoord0${NS};\n\tmediump vec4 color = v_color${NS};\n\tcolor *= ${TEXTURE_2D_FUNC}(u_sampler0${NS}, texCoord0);\n\t${FRAG_COLOR} = color;\n}\n"
             ,"");
  substitute((string *)&local_218,this,&local_278);
  ProgramContext::ProgramContext
            (local_1d8,(char *)vtxShaderSource_,(char *)local_218.m_data.m_data[0].m_data._0_8_,
             "a_position${NS}");
  pVVar2 = local_218.m_data.m_data + 1;
  if ((Vector<float,_4> *)local_218.m_data.m_data[0].m_data._0_8_ != pVVar2) {
    operator_delete((void *)local_218.m_data.m_data[0].m_data._0_8_,
                    local_218.m_data.m_data[1].m_data._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((Vector<float,_4> *)local_258.m_data.m_data[0].m_data._0_8_ != local_258.m_data.m_data + 1) {
    operator_delete((void *)local_258.m_data.m_data[0].m_data._0_8_,
                    local_258.m_data.m_data[1].m_data._0_8_ + 1);
  }
  local_258.m_data.m_data[0].m_data._0_8_ = local_258.m_data.m_data + 1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"a_position${NS}","");
  local_218.m_data.m_data[0].m_data._0_8_ = (pointer)0xbf800000bf800000;
  local_218.m_data.m_data[0].m_data[2] = -1.0;
  local_218.m_data.m_data[0].m_data[3] = -1.0;
  local_278._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  local_278._M_string_length = 0x3f8000003f800000;
  VarSpec::VarSpec<tcu::Vector<float,4>>
            ((VarSpec *)local_1d0,(string *)&local_258,(Vector<float,_4> *)&local_218,
             (Vector<float,_4> *)&local_278);
  pvVar1 = &local_1d8->attributes;
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((Vector<float,_4> *)local_258.m_data.m_data[0].m_data._0_8_ != local_258.m_data.m_data + 1) {
    operator_delete((void *)local_258.m_data.m_data[0].m_data._0_8_,
                    local_258.m_data.m_data[1].m_data._0_8_ + 1);
  }
  local_258.m_data.m_data[0].m_data._0_8_ = local_258.m_data.m_data + 1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"a_normal${NS}","");
  local_218.m_data.m_data[0].m_data._0_8_ = (pointer)0xbf800000bf800000;
  local_218.m_data.m_data[0].m_data[2] = -1.0;
  local_278._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  local_278._M_string_length = CONCAT44(local_278._M_string_length._4_4_,0x3f800000);
  VarSpec::VarSpec<tcu::Vector<float,3>>
            ((VarSpec *)local_1d0,(string *)&local_258,(Vector<float,_3> *)&local_218,
             (Vector<float,_3> *)&local_278);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((Vector<float,_4> *)local_258.m_data.m_data[0].m_data._0_8_ != local_258.m_data.m_data + 1) {
    operator_delete((void *)local_258.m_data.m_data[0].m_data._0_8_,
                    local_258.m_data.m_data[1].m_data._0_8_ + 1);
  }
  local_258.m_data.m_data[0].m_data._0_8_ = local_258.m_data.m_data + 1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"a_texCoord0${NS}","");
  local_218.m_data.m_data[0].m_data._0_8_ = (pointer)0xbf800000bf800000;
  local_218.m_data.m_data[0].m_data[2] = -1.0;
  local_218.m_data.m_data[0].m_data[3] = -1.0;
  local_278._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  local_278._M_string_length = 0x3f8000003f800000;
  VarSpec::VarSpec<tcu::Vector<float,4>>
            ((VarSpec *)local_1d0,(string *)&local_258,(Vector<float,_4> *)&local_218,
             (Vector<float,_4> *)&local_278);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((Vector<float,_4> *)local_258.m_data.m_data[0].m_data._0_8_ != local_258.m_data.m_data + 1) {
    operator_delete((void *)local_258.m_data.m_data[0].m_data._0_8_,
                    local_258.m_data.m_data[1].m_data._0_8_ + 1);
  }
  local_258.m_data.m_data[0].m_data._0_8_ = local_258.m_data.m_data + 1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"u_material${NS}.ambientColor","");
  local_218.m_data.m_data[0].m_data._8_8_ =
       local_218.m_data.m_data[0].m_data._8_8_ & 0xffffffff00000000;
  local_218.m_data.m_data[0].m_data._0_8_ = (pointer)0x0;
  local_278._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  local_278._M_string_length = CONCAT44(local_278._M_string_length._4_4_,0x3f800000);
  VarSpec::VarSpec<tcu::Vector<float,3>>
            ((VarSpec *)local_1d0,(string *)&local_258,(Vector<float,_3> *)&local_218,
             (Vector<float,_3> *)&local_278);
  pvVar1 = &local_1d8->uniforms;
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((Vector<float,_4> *)local_258.m_data.m_data[0].m_data._0_8_ != local_258.m_data.m_data + 1) {
    operator_delete((void *)local_258.m_data.m_data[0].m_data._0_8_,
                    local_258.m_data.m_data[1].m_data._0_8_ + 1);
  }
  local_258.m_data.m_data[0].m_data._0_8_ = local_258.m_data.m_data + 1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"u_material${NS}.diffuseColor","");
  local_218.m_data.m_data[0].m_data._0_8_ = (pointer)0x0;
  local_218.m_data.m_data[0].m_data[2] = 0.0;
  local_218.m_data.m_data[0].m_data[3] = 0.0;
  local_278._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  local_278._M_string_length = 0x3f8000003f800000;
  VarSpec::VarSpec<tcu::Vector<float,4>>
            ((VarSpec *)local_1d0,(string *)&local_258,(Vector<float,_4> *)&local_218,
             (Vector<float,_4> *)&local_278);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((Vector<float,_4> *)local_258.m_data.m_data[0].m_data._0_8_ != local_258.m_data.m_data + 1) {
    operator_delete((void *)local_258.m_data.m_data[0].m_data._0_8_,
                    local_258.m_data.m_data[1].m_data._0_8_ + 1);
  }
  local_258.m_data.m_data[0].m_data._0_8_ = local_258.m_data.m_data + 1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"u_material${NS}.emissiveColor","");
  local_218.m_data.m_data[0].m_data._8_8_ =
       local_218.m_data.m_data[0].m_data._8_8_ & 0xffffffff00000000;
  local_218.m_data.m_data[0].m_data._0_8_ = (pointer)0x0;
  local_278._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  local_278._M_string_length = CONCAT44(local_278._M_string_length._4_4_,0x3f800000);
  VarSpec::VarSpec<tcu::Vector<float,3>>
            ((VarSpec *)local_1d0,(string *)&local_258,(Vector<float,_3> *)&local_218,
             (Vector<float,_3> *)&local_278);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((Vector<float,_4> *)local_258.m_data.m_data[0].m_data._0_8_ != local_258.m_data.m_data + 1) {
    operator_delete((void *)local_258.m_data.m_data[0].m_data._0_8_,
                    local_258.m_data.m_data[1].m_data._0_8_ + 1);
  }
  local_258.m_data.m_data[0].m_data._0_8_ = local_258.m_data.m_data + 1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"u_material${NS}.specularColor","");
  local_218.m_data.m_data[0].m_data._8_8_ =
       local_218.m_data.m_data[0].m_data._8_8_ & 0xffffffff00000000;
  local_218.m_data.m_data[0].m_data._0_8_ = (pointer)0x0;
  local_278._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  local_278._M_string_length = CONCAT44(local_278._M_string_length._4_4_,0x3f800000);
  VarSpec::VarSpec<tcu::Vector<float,3>>
            ((VarSpec *)local_1d0,(string *)&local_258,(Vector<float,_3> *)&local_218,
             (Vector<float,_3> *)&local_278);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((Vector<float,_4> *)local_258.m_data.m_data[0].m_data._0_8_ != local_258.m_data.m_data + 1) {
    operator_delete((void *)local_258.m_data.m_data[0].m_data._0_8_,
                    local_258.m_data.m_data[1].m_data._0_8_ + 1);
  }
  local_258.m_data.m_data[0].m_data._0_8_ = local_258.m_data.m_data + 1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"u_material${NS}.shininess","");
  local_1d0._0_8_ = local_1d0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d0,local_258.m_data.m_data[0].m_data._0_8_,
             (pointer)(local_258.m_data.m_data[0].m_data._0_8_ +
                      local_258.m_data.m_data[0].m_data._8_8_));
  local_1d0._32_8_ = 1;
  local_1d0._100_4_ = 0x3f800000;
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((Vector<float,_4> *)local_258.m_data.m_data[0].m_data._0_8_ != local_258.m_data.m_data + 1) {
    operator_delete((void *)local_258.m_data.m_data[0].m_data._0_8_,
                    local_258.m_data.m_data[1].m_data._0_8_ + 1);
  }
  local_258.m_data.m_data[0].m_data._0_8_ = local_258.m_data.m_data + 1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"u_directionalLight${NS}[0].color","");
  local_218.m_data.m_data[0].m_data._8_8_ =
       local_218.m_data.m_data[0].m_data._8_8_ & 0xffffffff00000000;
  local_218.m_data.m_data[0].m_data._0_8_ = (pointer)0x0;
  local_278._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  local_278._M_string_length = CONCAT44(local_278._M_string_length._4_4_,0x3f800000);
  VarSpec::VarSpec<tcu::Vector<float,3>>
            ((VarSpec *)local_1d0,(string *)&local_258,(Vector<float,_3> *)&local_218,
             (Vector<float,_3> *)&local_278);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((Vector<float,_4> *)local_258.m_data.m_data[0].m_data._0_8_ != local_258.m_data.m_data + 1) {
    operator_delete((void *)local_258.m_data.m_data[0].m_data._0_8_,
                    local_258.m_data.m_data[1].m_data._0_8_ + 1);
  }
  local_258.m_data.m_data[0].m_data._0_8_ = local_258.m_data.m_data + 1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"u_directionalLight${NS}[0].position","");
  local_218.m_data.m_data[0].m_data._0_8_ = (pointer)0xbf800000bf800000;
  local_218.m_data.m_data[0].m_data[2] = -1.0;
  local_218.m_data.m_data[0].m_data[3] = -1.0;
  local_278._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  local_278._M_string_length = 0x3f8000003f800000;
  VarSpec::VarSpec<tcu::Vector<float,4>>
            ((VarSpec *)local_1d0,(string *)&local_258,(Vector<float,_4> *)&local_218,
             (Vector<float,_4> *)&local_278);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((Vector<float,_4> *)local_258.m_data.m_data[0].m_data._0_8_ != local_258.m_data.m_data + 1) {
    operator_delete((void *)local_258.m_data.m_data[0].m_data._0_8_,
                    local_258.m_data.m_data[1].m_data._0_8_ + 1);
  }
  local_258.m_data.m_data[0].m_data._0_8_ = local_258.m_data.m_data + 1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"u_directionalLight${NS}[0].direction","");
  local_218.m_data.m_data[0].m_data._0_8_ = (Vector<float,_4> *)0xbf800000bf800000;
  local_218.m_data.m_data[0].m_data[2] = -1.0;
  local_278._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  local_278._M_string_length = CONCAT44(local_278._M_string_length._4_4_,0x3f800000);
  VarSpec::VarSpec<tcu::Vector<float,3>>
            ((VarSpec *)local_1d0,(string *)&local_258,(Vector<float,_3> *)&local_218,
             (Vector<float,_3> *)&local_278);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((Vector<float,_4> *)local_258.m_data.m_data[0].m_data._0_8_ != local_258.m_data.m_data + 1) {
    operator_delete((void *)local_258.m_data.m_data[0].m_data._0_8_,
                    local_258.m_data.m_data[1].m_data._0_8_ + 1);
  }
  local_258.m_data.m_data[0].m_data._0_8_ = local_258.m_data.m_data + 1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"u_directionalLight${NS}[0].constantAttenuation","");
  local_1d0._0_8_ = local_1d0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d0,local_258.m_data.m_data[0].m_data._0_8_,
             (pointer)(local_258.m_data.m_data[0].m_data._0_8_ +
                      local_258.m_data.m_data[0].m_data._8_8_));
  local_1d0._32_8_ = 0x3dcccccd00000001;
  local_1d0._100_4_ = 0x3f800000;
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((Vector<float,_4> *)local_258.m_data.m_data[0].m_data._0_8_ != local_258.m_data.m_data + 1) {
    operator_delete((void *)local_258.m_data.m_data[0].m_data._0_8_,
                    local_258.m_data.m_data[1].m_data._0_8_ + 1);
  }
  local_258.m_data.m_data[0].m_data._0_8_ = local_258.m_data.m_data + 1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"u_directionalLight${NS}[0].linearAttenuation","");
  local_1d0._0_8_ = local_1d0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d0,local_258.m_data.m_data[0].m_data._0_8_,
             (pointer)(local_258.m_data.m_data[0].m_data._0_8_ +
                      local_258.m_data.m_data[0].m_data._8_8_));
  local_1d0._32_8_ = 0x3dcccccd00000001;
  local_1d0._100_4_ = 0x3f800000;
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((Vector<float,_4> *)local_258.m_data.m_data[0].m_data._0_8_ != local_258.m_data.m_data + 1) {
    operator_delete((void *)local_258.m_data.m_data[0].m_data._0_8_,
                    local_258.m_data.m_data[1].m_data._0_8_ + 1);
  }
  local_258.m_data.m_data[0].m_data._0_8_ = local_258.m_data.m_data + 1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"u_directionalLight${NS}[0].quadraticAttenuation","");
  local_1d0._0_8_ = local_1d0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d0,local_258.m_data.m_data[0].m_data._0_8_,
             (pointer)(local_258.m_data.m_data[0].m_data._0_8_ +
                      local_258.m_data.m_data[0].m_data._8_8_));
  local_1d0._32_8_ = 0x3dcccccd00000001;
  local_1d0._100_4_ = 0x3f800000;
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((Vector<float,_4> *)local_258.m_data.m_data[0].m_data._0_8_ != local_258.m_data.m_data + 1) {
    operator_delete((void *)local_258.m_data.m_data[0].m_data._0_8_,
                    local_258.m_data.m_data[1].m_data._0_8_ + 1);
  }
  local_258.m_data.m_data[0].m_data._0_8_ = local_258.m_data.m_data + 1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"u_directionalLight${NS}[0].spotExponent","");
  local_1d0._0_8_ = local_1d0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d0,local_258.m_data.m_data[0].m_data._0_8_,
             (pointer)(local_258.m_data.m_data[0].m_data._0_8_ +
                      local_258.m_data.m_data[0].m_data._8_8_));
  local_1d0._32_8_ = 0x3dcccccd00000001;
  local_1d0._100_4_ = 0x3f800000;
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((Vector<float,_4> *)local_258.m_data.m_data[0].m_data._0_8_ != local_258.m_data.m_data + 1) {
    operator_delete((void *)local_258.m_data.m_data[0].m_data._0_8_,
                    local_258.m_data.m_data[1].m_data._0_8_ + 1);
  }
  local_258.m_data.m_data[0].m_data._0_8_ = local_258.m_data.m_data + 1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"u_directionalLight${NS}[0].spotCutoff","");
  local_1d0._0_8_ = local_1d0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d0,local_258.m_data.m_data[0].m_data._0_8_,
             (pointer)(local_258.m_data.m_data[0].m_data._0_8_ +
                      local_258.m_data.m_data[0].m_data._8_8_));
  local_1d0._32_8_ = 0x3dcccccd00000001;
  local_1d0._100_4_ = 0x3f800000;
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((Vector<float,_4> *)local_258.m_data.m_data[0].m_data._0_8_ != local_258.m_data.m_data + 1) {
    operator_delete((void *)local_258.m_data.m_data[0].m_data._0_8_,
                    local_258.m_data.m_data[1].m_data._0_8_ + 1);
  }
  local_258.m_data.m_data[0].m_data._0_8_ = local_258.m_data.m_data + 1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"u_directionalLightCount${NS}","");
  local_1d0._0_8_ = local_1d0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d0,local_258.m_data.m_data[0].m_data._0_8_,
             (pointer)(local_258.m_data.m_data[0].m_data._0_8_ +
                      local_258.m_data.m_data[0].m_data._8_8_));
  local_1d0._32_8_ = 0x10000001b;
  local_1d0._100_4_ = 1.4013e-45;
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((Vector<float,_4> *)local_258.m_data.m_data[0].m_data._0_8_ != local_258.m_data.m_data + 1) {
    operator_delete((void *)local_258.m_data.m_data[0].m_data._0_8_,
                    local_258.m_data.m_data[1].m_data._0_8_ + 1);
  }
  iVar6 = 0;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
    std::ostream::operator<<((VarSpec *)local_1d0,iVar6);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
    std::ios_base::~ios_base((ios_base *)(local_1d0 + 0x70));
    std::operator+(&local_278,"u_spotLight${NS}[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_258);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_278);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((Vector<float,_4> *)*plVar4 == (Vector<float,_4> *)psVar5) {
      local_218.m_data.m_data[1].m_data._0_8_ = *psVar5;
      local_218.m_data.m_data[1].m_data._8_8_ = plVar4[3];
      local_218.m_data.m_data[0].m_data._0_8_ = pVVar2;
    }
    else {
      local_218.m_data.m_data[1].m_data._0_8_ = *psVar5;
      local_218.m_data.m_data[0].m_data._0_8_ = (Vector<float,_4> *)*plVar4;
    }
    local_218.m_data.m_data[0].m_data._8_8_ = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_48.m_data[0] = 0.0;
    local_48.m_data[1] = 0.0;
    local_48.m_data._8_8_ = local_48.m_data._8_8_ & 0xffffffff00000000;
    local_58.m_data[0] = 1.0;
    local_58.m_data[1] = 1.0;
    local_58.m_data[2] = 1.0;
    VarSpec::VarSpec<tcu::Vector<float,3>>
              ((VarSpec *)local_1d0,(string *)&local_218,(Vector<float,_3> *)&local_48,
               (Vector<float,_3> *)&local_58);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
    emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    }
    if ((Vector<float,_4> *)local_218.m_data.m_data[0].m_data._0_8_ != pVVar2) {
      operator_delete((void *)local_218.m_data.m_data[0].m_data._0_8_,
                      local_218.m_data.m_data[1].m_data._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_278,"u_spotLight${NS}[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_258);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_278);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((Vector<float,_4> *)*plVar4 == (Vector<float,_4> *)psVar5) {
      local_218.m_data.m_data[1].m_data._0_8_ = *psVar5;
      local_218.m_data.m_data[1].m_data._8_8_ = plVar4[3];
      local_218.m_data.m_data[0].m_data._0_8_ = pVVar2;
    }
    else {
      local_218.m_data.m_data[1].m_data._0_8_ = *psVar5;
      local_218.m_data.m_data[0].m_data._0_8_ = (Vector<float,_4> *)*plVar4;
    }
    local_218.m_data.m_data[0].m_data._8_8_ = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_48.m_data[0] = -1.0;
    local_48.m_data[1] = -1.0;
    local_48.m_data[2] = -1.0;
    local_48.m_data[3] = -1.0;
    local_58.m_data[0] = 1.0;
    local_58.m_data[1] = 1.0;
    local_58.m_data[2] = 1.0;
    local_58.m_data[3] = 1.0;
    VarSpec::VarSpec<tcu::Vector<float,4>>
              ((VarSpec *)local_1d0,(string *)&local_218,&local_48,&local_58);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
    emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    }
    if ((Vector<float,_4> *)local_218.m_data.m_data[0].m_data._0_8_ != pVVar2) {
      operator_delete((void *)local_218.m_data.m_data[0].m_data._0_8_,
                      local_218.m_data.m_data[1].m_data._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_278,"u_spotLight${NS}[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_258);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_278);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((Vector<float,_4> *)*plVar4 == (Vector<float,_4> *)psVar5) {
      local_218.m_data.m_data[1].m_data._0_8_ = *psVar5;
      local_218.m_data.m_data[1].m_data._8_8_ = plVar4[3];
      local_218.m_data.m_data[0].m_data._0_8_ = pVVar2;
    }
    else {
      local_218.m_data.m_data[1].m_data._0_8_ = *psVar5;
      local_218.m_data.m_data[0].m_data._0_8_ = (Vector<float,_4> *)*plVar4;
    }
    local_218.m_data.m_data[0].m_data._8_8_ = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_48.m_data[0] = -1.0;
    local_48.m_data[1] = -1.0;
    local_48.m_data[2] = -1.0;
    local_58.m_data[0] = 1.0;
    local_58.m_data[1] = 1.0;
    local_58.m_data[2] = 1.0;
    VarSpec::VarSpec<tcu::Vector<float,3>>
              ((VarSpec *)local_1d0,(string *)&local_218,(Vector<float,_3> *)&local_48,
               (Vector<float,_3> *)&local_58);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
    emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    }
    if ((Vector<float,_4> *)local_218.m_data.m_data[0].m_data._0_8_ != pVVar2) {
      operator_delete((void *)local_218.m_data.m_data[0].m_data._0_8_,
                      local_218.m_data.m_data[1].m_data._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_278,"u_spotLight${NS}[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_258);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_278);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((Vector<float,_4> *)*plVar4 == (Vector<float,_4> *)psVar5) {
      local_218.m_data.m_data[1].m_data._0_8_ = *psVar5;
      local_218.m_data.m_data[1].m_data._8_8_ = plVar4[3];
      local_218.m_data.m_data[0].m_data._0_8_ = pVVar2;
    }
    else {
      local_218.m_data.m_data[1].m_data._0_8_ = *psVar5;
      local_218.m_data.m_data[0].m_data._0_8_ = (Vector<float,_4> *)*plVar4;
    }
    local_218.m_data.m_data[0].m_data._8_8_ = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_1d0._0_8_ = local_1d0 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1d0,local_218.m_data.m_data[0].m_data._0_8_,
               (pointer)(local_218.m_data.m_data[0].m_data._0_8_ +
                        local_218.m_data.m_data[0].m_data._8_8_));
    local_1d0._32_8_ = 0x3dcccccd00000001;
    local_1d0._100_4_ = 0x3f800000;
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
    emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    }
    if ((Vector<float,_4> *)local_218.m_data.m_data[0].m_data._0_8_ != pVVar2) {
      operator_delete((void *)local_218.m_data.m_data[0].m_data._0_8_,
                      local_218.m_data.m_data[1].m_data._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_278,"u_spotLight${NS}[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_258);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_278);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((Vector<float,_4> *)*plVar4 == (Vector<float,_4> *)psVar5) {
      local_218.m_data.m_data[1].m_data._0_8_ = *psVar5;
      local_218.m_data.m_data[1].m_data._8_8_ = plVar4[3];
      local_218.m_data.m_data[0].m_data._0_8_ = pVVar2;
    }
    else {
      local_218.m_data.m_data[1].m_data._0_8_ = *psVar5;
      local_218.m_data.m_data[0].m_data._0_8_ = (Vector<float,_4> *)*plVar4;
    }
    local_218.m_data.m_data[0].m_data._8_8_ = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_1d0._0_8_ = local_1d0 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1d0,local_218.m_data.m_data[0].m_data._0_8_,
               (pointer)(local_218.m_data.m_data[0].m_data._0_8_ +
                        local_218.m_data.m_data[0].m_data._8_8_));
    local_1d0._32_8_ = 0x3dcccccd00000001;
    local_1d0._100_4_ = 0x3f800000;
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
    emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    }
    if ((Vector<float,_4> *)local_218.m_data.m_data[0].m_data._0_8_ != pVVar2) {
      operator_delete((void *)local_218.m_data.m_data[0].m_data._0_8_,
                      local_218.m_data.m_data[1].m_data._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_278,"u_spotLight${NS}[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_258);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_278);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((Vector<float,_4> *)*plVar4 == (Vector<float,_4> *)psVar5) {
      local_218.m_data.m_data[1].m_data._0_8_ = *psVar5;
      local_218.m_data.m_data[1].m_data._8_8_ = plVar4[3];
      local_218.m_data.m_data[0].m_data._0_8_ = pVVar2;
    }
    else {
      local_218.m_data.m_data[1].m_data._0_8_ = *psVar5;
      local_218.m_data.m_data[0].m_data._0_8_ = (Vector<float,_4> *)*plVar4;
    }
    local_218.m_data.m_data[0].m_data._8_8_ = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_1d0._0_8_ = local_1d0 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1d0,local_218.m_data.m_data[0].m_data._0_8_,
               (pointer)(local_218.m_data.m_data[0].m_data._0_8_ +
                        local_218.m_data.m_data[0].m_data._8_8_));
    local_1d0._32_8_ = 0x3dcccccd00000001;
    local_1d0._100_4_ = 0x3f800000;
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
    emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    }
    if ((Vector<float,_4> *)local_218.m_data.m_data[0].m_data._0_8_ != pVVar2) {
      operator_delete((void *)local_218.m_data.m_data[0].m_data._0_8_,
                      local_218.m_data.m_data[1].m_data._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_278,"u_spotLight${NS}[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_258);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_278);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((Vector<float,_4> *)*plVar4 == (Vector<float,_4> *)psVar5) {
      local_218.m_data.m_data[1].m_data._0_8_ = *psVar5;
      local_218.m_data.m_data[1].m_data._8_8_ = plVar4[3];
      local_218.m_data.m_data[0].m_data._0_8_ = pVVar2;
    }
    else {
      local_218.m_data.m_data[1].m_data._0_8_ = *psVar5;
      local_218.m_data.m_data[0].m_data._0_8_ = (Vector<float,_4> *)*plVar4;
    }
    local_218.m_data.m_data[0].m_data._8_8_ = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_1d0._0_8_ = local_1d0 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1d0,local_218.m_data.m_data[0].m_data._0_8_,
               (pointer)(local_218.m_data.m_data[0].m_data._0_8_ +
                        local_218.m_data.m_data[0].m_data._8_8_));
    local_1d0._32_8_ = 0x3dcccccd00000001;
    local_1d0._100_4_ = 0x3f800000;
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
    emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    }
    if ((Vector<float,_4> *)local_218.m_data.m_data[0].m_data._0_8_ != pVVar2) {
      operator_delete((void *)local_218.m_data.m_data[0].m_data._0_8_,
                      local_218.m_data.m_data[1].m_data._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_278,"u_spotLight${NS}[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_258);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_278);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((Vector<float,_4> *)*plVar4 == (Vector<float,_4> *)psVar5) {
      local_218.m_data.m_data[1].m_data._0_8_ = *psVar5;
      local_218.m_data.m_data[1].m_data._8_8_ = plVar4[3];
      local_218.m_data.m_data[0].m_data._0_8_ = pVVar2;
    }
    else {
      local_218.m_data.m_data[1].m_data._0_8_ = *psVar5;
      local_218.m_data.m_data[0].m_data._0_8_ = (Vector<float,_4> *)*plVar4;
    }
    local_218.m_data.m_data[0].m_data._8_8_ = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_1d0._0_8_ = local_1d0 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1d0,local_218.m_data.m_data[0].m_data._0_8_,
               (pointer)(local_218.m_data.m_data[0].m_data._0_8_ +
                        local_218.m_data.m_data[0].m_data._8_8_));
    local_1d0._32_8_ = 0x3dcccccd00000001;
    local_1d0._100_4_ = 1.0;
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
    emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    }
    if ((Vector<float,_4> *)local_218.m_data.m_data[0].m_data._0_8_ != pVVar2) {
      operator_delete((void *)local_218.m_data.m_data[0].m_data._0_8_,
                      local_218.m_data.m_data[1].m_data._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((Vector<float,_4> *)local_258.m_data.m_data[0].m_data._0_8_ != local_258.m_data.m_data + 1)
    {
      operator_delete((void *)local_258.m_data.m_data[0].m_data._0_8_,
                      local_258.m_data.m_data[1].m_data._0_8_ + 1);
    }
    iVar6 = iVar6 + 1;
  } while (iVar6 != 4);
  local_258.m_data.m_data[0].m_data._0_8_ = local_258.m_data.m_data + 1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"u_spotLightCount${NS}","");
  local_1d0._0_8_ = local_1d0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d0,local_258.m_data.m_data[0].m_data._0_8_,
             (pointer)(local_258.m_data.m_data[0].m_data._0_8_ +
                      local_258.m_data.m_data[0].m_data._8_8_));
  local_1d0._32_8_ = 0x40000001b;
  local_1d0._100_4_ = 5.60519e-45;
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((Vector<float,_4> *)local_258.m_data.m_data[0].m_data._0_8_ != local_258.m_data.m_data + 1) {
    operator_delete((void *)local_258.m_data.m_data[0].m_data._0_8_,
                    local_258.m_data.m_data[1].m_data._0_8_ + 1);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"u_mvpMatrix${NS}","");
  translationMat<4>(&local_258,-0.2);
  translationMat<4>(&local_218,0.2);
  VarSpec::VarSpec<tcu::Matrix<float,4,4>>((VarSpec *)local_1d0,&local_278,&local_258,&local_218);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"u_modelViewMatrix${NS}","");
  translationMat<4>(&local_258,-0.2);
  translationMat<4>(&local_218,0.2);
  VarSpec::VarSpec<tcu::Matrix<float,4,4>>((VarSpec *)local_1d0,&local_278,&local_258,&local_218);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"u_normalMatrix${NS}","");
  translationMat<3>(-0.2);
  translationMat<3>(0.2);
  VarSpec::VarSpec<tcu::Matrix<float,3,3>>
            ((VarSpec *)local_1d0,&local_278,(Matrix<float,_3,_3> *)&local_258,
             (Matrix<float,_3,_3> *)&local_218);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"u_texCoordMatrix0${NS}","");
  translationMat<4>(&local_258,-0.2);
  translationMat<4>(&local_218,0.2);
  VarSpec::VarSpec<tcu::Matrix<float,4,4>>((VarSpec *)local_1d0,&local_278,&local_258,&local_218);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_258.m_data.m_data[0].m_data._0_8_ = local_258.m_data.m_data + 1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"u_sampler0${NS}","");
  local_1d0._0_8_ = local_1d0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d0,local_258.m_data.m_data[0].m_data._0_8_,
             (pointer)(local_258.m_data.m_data[0].m_data._0_8_ +
                      local_258.m_data.m_data[0].m_data._8_8_));
  local_1d0._32_8_ = 0x1b;
  local_1d0._100_4_ = 0.0;
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,(VarSpec *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((Vector<float,_4> *)local_258.m_data.m_data[0].m_data._0_8_ != local_258.m_data.m_data + 1) {
    operator_delete((void *)local_258.m_data.m_data[0].m_data._0_8_,
                    local_258.m_data.m_data[1].m_data._0_8_ + 1);
  }
  pPVar3 = local_1d8;
  local_1d0._0_8_ = (pointer)0x0;
  local_1d0._8_4_ = local_38;
  local_1d0._12_4_ = local_34;
  local_1d0._16_8_ = 0x140100001908;
  local_1d0._24_4_ = 0x1908;
  local_1d0[0x1c] = '\x01';
  local_1d0._32_8_ = 0x260100002601;
  local_1d0._40_8_ = 0x290100002901;
  local_1d0._48_8_ = 0;
  local_1d0._56_8_ = 0;
  local_1d0._64_8_ = 0x3f8000003f800000;
  local_1d0._72_8_ = 0x3f8000003f800000;
  std::vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>::
  emplace_back<deqp::gls::TextureSpec>(&local_1d8->textureSpecs,(TextureSpec *)local_1d0);
  return pPVar3;
}

Assistant:

gls::ProgramContext ProgramLibrary::generateVertexUniformLoopLightContext (const int texWid, const int texHei) const
{
	static const char* const vertexTemplate =
		"${VTX_HEADER}"
		"struct Material {\n"
		"	mediump vec3 ambientColor;\n"
		"	mediump vec4 diffuseColor;\n"
		"	mediump vec3 emissiveColor;\n"
		"	mediump vec3 specularColor;\n"
		"	mediump float shininess;\n"
		"};\n"
		"struct Light {\n"
		"	mediump vec3 color;\n"
		"	mediump vec4 position;\n"
		"	mediump vec3 direction;\n"
		"	mediump float constantAttenuation;\n"
		"	mediump float linearAttenuation;\n"
		"	mediump float quadraticAttenuation;\n"
		"	mediump float spotExponent;\n"
		"	mediump float spotCutoff;\n"
		"};\n"
		"${VTX_IN} highp vec4 a_position${NS};\n"
		"${VTX_IN} mediump vec3 a_normal${NS};\n"
		"${VTX_IN} mediump vec4 a_texCoord0${NS};\n"
		"uniform Material u_material${NS};\n"
		"uniform Light u_directionalLight${NS}[1];\n"
		"uniform mediump int u_directionalLightCount${NS};\n"
		"uniform Light u_spotLight${NS}[4];\n"
		"uniform mediump int u_spotLightCount${NS};\n"
		"uniform highp mat4 u_mvpMatrix${NS};\n"
		"uniform highp mat4 u_modelViewMatrix${NS};\n"
		"uniform mediump mat3 u_normalMatrix${NS};\n"
		"uniform mediump mat4 u_texCoordMatrix0${NS};\n"
		"${VTX_OUT} mediump vec4 v_color${NS};\n"
		"${VTX_OUT} mediump vec2 v_texCoord0${NS};\n"
		"mediump vec3 direction (mediump vec4 from, mediump vec4 to)\n"
		"{\n"
		"	return vec3(to.xyz * from.w - from.xyz * to.w);\n"
		"}\n"
		"\n"
		"mediump vec3 computeLighting (\n"
		"	mediump vec3 directionToLight,\n"
		"	mediump vec3 halfVector,\n"
		"	mediump vec3 normal,\n"
		"	mediump vec3 lightColor,\n"
		"	mediump vec3 diffuseColor,\n"
		"	mediump vec3 specularColor,\n"
		"	mediump float shininess)\n"
		"{\n"
		"	mediump float normalDotDirection  = max(dot(normal, directionToLight), 0.0);\n"
		"	mediump vec3  color               = normalDotDirection * diffuseColor * lightColor;\n"
		"\n"
		"	if (normalDotDirection != 0.0)\n"
		"		color += pow(max(dot(normal, halfVector), 0.0), shininess) * specularColor * lightColor;\n"
		"\n"
		"	return color;\n"
		"}\n"
		"\n"
		"mediump float computeDistanceAttenuation (mediump float distToLight, mediump float constAtt, mediump float linearAtt, mediump float quadraticAtt)\n"
		"{\n"
		"	return 1.0 / (constAtt + linearAtt * distToLight + quadraticAtt * distToLight * distToLight);\n"
		"}\n"
		"\n"
		"mediump float computeSpotAttenuation (\n"
		"	mediump vec3  directionToLight,\n"
		"	mediump vec3  lightDir,\n"
		"	mediump float spotExponent,\n"
		"	mediump float spotCutoff)\n"
		"{\n"
		"	mediump float spotEffect = dot(lightDir, normalize(-directionToLight));\n"
		"\n"
		"	if (spotEffect < spotCutoff)\n"
		"		spotEffect = 0.0;\n"
		"\n"
		"	spotEffect = pow(spotEffect, spotExponent);\n"
		"	return spotEffect;\n"
		"}\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	highp vec4 position = a_position${NS};\n"
		"	highp vec3 normal = a_normal${NS};\n"
		"	gl_Position = u_mvpMatrix${NS} * position;\n"
		"	v_texCoord0${NS} = (u_texCoordMatrix0${NS} * a_texCoord0${NS}).xy;\n"
		"	mediump vec4 color = vec4(u_material${NS}.emissiveColor, u_material${NS}.diffuseColor.a);\n"
		"\n"
		"	highp vec4 eyePosition = u_modelViewMatrix${NS} * position;\n"
		"	mediump vec3 eyeNormal = normalize(u_normalMatrix${NS} * normal);\n"
		"	for (int i = 0; i < u_directionalLightCount${NS}; i++)\n"
		"	{\n"
		"		mediump vec3 directionToLight = -u_directionalLight${NS}[i].direction;\n"
		"		mediump vec3 halfVector = normalize(directionToLight + vec3(0.0, 0.0, 1.0));\n"
		"		color.rgb += computeLighting(directionToLight, halfVector, eyeNormal, u_directionalLight${NS}[i].color, u_material${NS}.diffuseColor.rgb, u_material${NS}.specularColor, u_material${NS}.shininess);\n"
		"	}\n"
		"\n"
		"	for (int i = 0; i < u_spotLightCount${NS}; i++)\n"
		"	{\n"
		"		mediump float distanceToLight = distance(eyePosition, u_spotLight${NS}[i].position);\n"
		"		mediump vec3 directionToLight = normalize(direction(eyePosition, u_spotLight${NS}[i].position));\n"
		"		mediump vec3 halfVector = normalize(directionToLight + vec3(0.0, 0.0, 1.0));\n"
		"		color.rgb += computeLighting(directionToLight, halfVector, eyeNormal, u_spotLight${NS}[i].color, u_material${NS}.diffuseColor.rgb, u_material${NS}.specularColor, u_material${NS}.shininess) * computeDistanceAttenuation(distanceToLight, u_spotLight${NS}[i].constantAttenuation, u_spotLight${NS}[i].linearAttenuation, u_spotLight${NS}[i].quadraticAttenuation) * computeSpotAttenuation(directionToLight, u_spotLight${NS}[i].direction, u_spotLight${NS}[i].spotExponent, u_spotLight${NS}[i].spotCutoff);\n"
		"	}\n"
		"\n"
		"\n"
		"	v_color${NS} = color;\n"
		"}\n";

	static const char* const fragmentTemplate =
		"${FRAG_HEADER}"
		"uniform sampler2D u_sampler0${NS};\n"
		"${FRAG_IN} mediump vec4 v_color${NS};\n"
		"${FRAG_IN} mediump vec2 v_texCoord0${NS};\n"
		"void main (void)\n"
		"{\n"
		"	mediump vec2 texCoord0 = v_texCoord0${NS};\n"
		"	mediump vec4 color = v_color${NS};\n"
		"	color *= ${TEXTURE_2D_FUNC}(u_sampler0${NS}, texCoord0);\n"
		"	${FRAG_COLOR} = color;\n"
		"}\n";

	gls::ProgramContext context(substitute(vertexTemplate).c_str(), substitute(fragmentTemplate).c_str(), "a_position${NS}");

	context.attributes.push_back	(gls::VarSpec("a_position${NS}",									Vec4(-1.0f),				Vec4(1.0f)));
	context.attributes.push_back	(gls::VarSpec("a_normal${NS}",										Vec3(-1.0f),				Vec3(1.0f)));
	context.attributes.push_back	(gls::VarSpec("a_texCoord0${NS}",									Vec4(-1.0f),				Vec4(1.0f)));

	context.uniforms.push_back		(gls::VarSpec("u_material${NS}.ambientColor",						Vec3(0.0f),					Vec3(1.0f)));
	context.uniforms.push_back		(gls::VarSpec("u_material${NS}.diffuseColor",						Vec4(0.0f),					Vec4(1.0f)));
	context.uniforms.push_back		(gls::VarSpec("u_material${NS}.emissiveColor",						Vec3(0.0f),					Vec3(1.0f)));
	context.uniforms.push_back		(gls::VarSpec("u_material${NS}.specularColor",						Vec3(0.0f),					Vec3(1.0f)));
	context.uniforms.push_back		(gls::VarSpec("u_material${NS}.shininess",							0.0f,						1.0f));

	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].color",					Vec3(0.0f),					Vec3(1.0f)));
	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].position",				Vec4(-1.0f),				Vec4(1.0f)));
	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].direction",				Vec3(-1.0f),				Vec3(1.0f)));
	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].constantAttenuation",		0.1f,						1.0f));
	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].linearAttenuation",		0.1f,						1.0f));
	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].quadraticAttenuation",	0.1f,						1.0f));
	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].spotExponent",			0.1f,						1.0f));
	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].spotCutoff",				0.1f,						1.0f));

	context.uniforms.push_back		(gls::VarSpec("u_directionalLightCount${NS}",						1));

	for (int i = 0; i < 4; i++)
	{
		const std::string ndxStr = de::toString(i);

		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].color",					Vec3(0.0f),					Vec3(1.0f)));
		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].position",				Vec4(-1.0f),				Vec4(1.0f)));
		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].direction",				Vec3(-1.0f),				Vec3(1.0f)));
		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].constantAttenuation",		0.1f,						1.0f));
		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].linearAttenuation",		0.1f,						1.0f));
		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].quadraticAttenuation",	0.1f,						1.0f));
		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].spotExponent",			0.1f,						1.0f));
		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].spotCutoff",				0.1f,						1.0f));
	}

	context.uniforms.push_back		(gls::VarSpec("u_spotLightCount${NS}",								4));

	context.uniforms.push_back		(gls::VarSpec("u_mvpMatrix${NS}",									translationMat<4>(-0.2f),	translationMat<4>(0.2f)));
	context.uniforms.push_back		(gls::VarSpec("u_modelViewMatrix${NS}",								translationMat<4>(-0.2f),	translationMat<4>(0.2f)));
	context.uniforms.push_back		(gls::VarSpec("u_normalMatrix${NS}",								translationMat<3>(-0.2f),	translationMat<3>(0.2f)));
	context.uniforms.push_back		(gls::VarSpec("u_texCoordMatrix0${NS}",								translationMat<4>(-0.2f),	translationMat<4>(0.2f)));

	context.uniforms.push_back		(gls::VarSpec("u_sampler0${NS}",									0));

	context.textureSpecs.push_back	(gls::TextureSpec(glu::TextureTestUtil::TEXTURETYPE_2D, 0,
													  texWid, texHei, GL_RGBA, GL_UNSIGNED_BYTE, GL_RGBA,
													  true, GL_LINEAR, GL_LINEAR, GL_REPEAT, GL_REPEAT,
													  Vec4(0.0f), Vec4(1.0f)));

	return context;
}